

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O3

void cfl_subtract_average_8x8_c(uint16_t *src,int16_t *dst)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  int j;
  int iVar11;
  long lVar12;
  int i;
  uint uVar13;
  
  uVar13 = 0x20;
  lVar12 = 0;
  do {
    uVar1 = *(ulong *)((long)src + lVar12);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3._12_2_ = (short)(uVar1 >> 0x30);
    auVar5._8_2_ = (short)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._10_4_ = auVar3._10_4_;
    auVar9._6_8_ = 0;
    auVar9._0_6_ = auVar5._8_6_;
    auVar7._4_2_ = (short)(uVar1 >> 0x10);
    auVar7._0_4_ = (uint)uVar1;
    auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
    uVar2 = *(ulong *)((long)src + lVar12 + 8);
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4._12_2_ = (short)(uVar2 >> 0x30);
    auVar6._8_2_ = (short)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._10_4_ = auVar4._10_4_;
    auVar10._6_8_ = 0;
    auVar10._0_6_ = auVar6._8_6_;
    auVar8._4_2_ = (short)(uVar2 >> 0x10);
    auVar8._0_4_ = (uint)uVar2;
    auVar8._6_8_ = SUB148(auVar10 << 0x40,6);
    uVar13 = (auVar4._10_4_ >> 0x10) + (auVar3._10_4_ >> 0x10) + auVar8._4_4_ + auVar7._4_4_ +
             auVar6._8_4_ + auVar5._8_4_ + ((uint)uVar2 & 0xffff) + ((uint)uVar1 & 0xffff) + uVar13;
    lVar12 = lVar12 + 0x40;
  } while ((int)lVar12 != 0x200);
  iVar11 = 0;
  do {
    lVar12 = 0;
    do {
      dst[lVar12] = src[lVar12] - (short)(uVar13 >> 6);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
    src = src + 0x20;
    dst = dst + 0x20;
    iVar11 = iVar11 + 1;
  } while (iVar11 != 8);
  return;
}

Assistant:

CFL_SUB_AVG_FN(c)

static inline int cfl_idx_to_alpha(uint8_t alpha_idx, int8_t joint_sign,
                                   CFL_PRED_TYPE pred_type) {
  const int alpha_sign = (pred_type == CFL_PRED_U) ? CFL_SIGN_U(joint_sign)
                                                   : CFL_SIGN_V(joint_sign);
  if (alpha_sign == CFL_SIGN_ZERO) return 0;
  const int abs_alpha_q3 =
      (pred_type == CFL_PRED_U) ? CFL_IDX_U(alpha_idx) : CFL_IDX_V(alpha_idx);
  return (alpha_sign == CFL_SIGN_POS) ? abs_alpha_q3 + 1 : -abs_alpha_q3 - 1;
}